

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O2

void __thiscall embree::XML::~XML(XML *this)

{
  ~XML(this);
  ::operator_delete(this);
  return;
}

Assistant:

XML (const std::string& name = "") : name(name) {}